

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O3

bool duckdb::TryAddOperator::Operation<long,long,long>(int64_t left,int64_t right,int64_t *result)

{
  *result = left + right;
  return !SCARRY8(left,right);
}

Assistant:

bool TryAddOperator::Operation(int64_t left, int64_t right, int64_t &result) {
#if (__GNUC__ >= 5) || defined(__clang__)
	if (__builtin_add_overflow(left, right, &result)) {
		return false;
	}
#else
	// https://blog.regehr.org/archives/1139
	result = int64_t((uint64_t)left + (uint64_t)right);
	if ((left < 0 && right < 0 && result >= 0) || (left >= 0 && right >= 0 && result < 0)) {
		return false;
	}
#endif
	return true;
}